

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_string_tpl.h
# Opt level: O2

void insert_string_roll(deflate_state *s,uint32_t str,uint32_t count)

{
  byte *pbVar1;
  Pos PVar2;
  uchar *puVar3;
  Pos *pPVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  puVar3 = s->window;
  uVar6 = (ulong)str;
  lVar5 = count + uVar6;
  for (; pbVar1 = puVar3 + uVar6 + 2, pbVar1 < puVar3 + lVar5 + 2; uVar6 = uVar6 + 1) {
    uVar7 = (s->ins_h & 0x3ff) << 5 ^ (uint)*pbVar1;
    s->ins_h = uVar7;
    pPVar4 = s->head;
    PVar2 = pPVar4[uVar7];
    if ((Pos)uVar6 != PVar2) {
      s->prev[(uint)(ushort)s->w_mask & (uint)uVar6] = PVar2;
      pPVar4[uVar7] = (Pos)uVar6;
    }
  }
  return;
}

Assistant:

Z_INTERNAL void INSERT_STRING(deflate_state *const s, uint32_t str, uint32_t count) {
    uint8_t *strstart = s->window + str + HASH_CALC_OFFSET;
    uint8_t *strend = strstart + count;

    for (Pos idx = (Pos)str; strstart < strend; idx++, strstart++) {
        uint32_t val, hm;

        HASH_CALC_VAR_INIT;
        HASH_CALC_READ;
        HASH_CALC(HASH_CALC_VAR, val);
        HASH_CALC_VAR &= HASH_CALC_MASK;
        hm = HASH_CALC_VAR;

        Pos head = s->head[hm];
        if (LIKELY(head != idx)) {
            s->prev[idx & s->w_mask] = head;
            s->head[hm] = idx;
        }
    }
}